

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

EGLConfig __thiscall deqp::egl::Image::ImageFormatCase::getConfig(ImageFormatCase *this)

{
  Library *egl;
  EGLConfig pvVar1;
  EGLint local_58 [2];
  EGLint attribList [15];
  ImageFormatCase *this_local;
  
  memcpy(local_58,&DAT_00597350,0x3c);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::chooseSingleConfig(egl,this->m_display,local_58);
  return pvVar1;
}

Assistant:

EGLConfig ImageFormatCase::getConfig (void)
{
	const EGLint attribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_RED_SIZE,			8,
		EGL_BLUE_SIZE,			8,
		EGL_GREEN_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_DEPTH_SIZE,			8,
		EGL_NONE
	};

	return eglu::chooseSingleConfig(m_eglTestCtx.getLibrary(), m_display, attribList);
}